

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_json.hpp
# Opt level: O0

void jsoncons::
     encode_json<std::vector<std::variant<(anonymous_namespace)::ns::Rectangle_AGSN,(anonymous_namespace)::ns::Triangle_AGSN,(anonymous_namespace)::ns::Circle_AGSN>,std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_AGSN,(anonymous_namespace)::ns::Triangle_AGSN,(anonymous_namespace)::ns::Circle_AGSN>>>,char>
               (vector<std::variant<(anonymous_namespace)::ns::Rectangle_AGSN,_(anonymous_namespace)::ns::Triangle_AGSN,_(anonymous_namespace)::ns::Circle_AGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_AGSN,_(anonymous_namespace)::ns::Triangle_AGSN,_(anonymous_namespace)::ns::Circle_AGSN>_>_>
                *val,basic_json_visitor<char> *encoder)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  error_code ec;
  error_code *in_stack_ffffffffffffff80;
  ser_error *this;
  error_code *in_stack_ffffffffffffffc8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_json_visitor<char> *in_stack_ffffffffffffffd8;
  vector<std::variant<(anonymous_namespace)::ns::Rectangle_AGSN,_(anonymous_namespace)::ns::Triangle_AGSN,_(anonymous_namespace)::ns::Circle_AGSN>,_std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_AGSN,_(anonymous_namespace)::ns::Triangle_AGSN,_(anonymous_namespace)::ns::Circle_AGSN>_>_>
  *in_stack_ffffffffffffffe0;
  error_category *peStack_18;
  
  this = (ser_error *)&stack0xffffffffffffffe0;
  std::error_code::error_code(in_stack_ffffffffffffff80);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_ffffffffffffff80);
  encode_traits<std::vector<std::variant<(anonymous_namespace)::ns::Rectangle_AGSN,(anonymous_namespace)::ns::Triangle_AGSN,(anonymous_namespace)::ns::Circle_AGSN>,std::allocator<std::variant<(anonymous_namespace)::ns::Rectangle_AGSN,(anonymous_namespace)::ns::Triangle_AGSN,(anonymous_namespace)::ns::Circle_AGSN>>>,char,void>
  ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xc27f8e);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    basic_json_visitor<char>::flush((basic_json_visitor<char> *)0xc28027);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  ec_00._M_cat = peStack_18;
  ec_00._0_8_ = in_stack_ffffffffffffffe0;
  ser_error::ser_error(this,ec_00);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void encode_json(const T& val, basic_json_visitor<CharT>& encoder)
    {
        std::error_code ec;
        encode_traits<T,CharT>::encode(val, encoder, basic_json<CharT>(), ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        encoder.flush();
    }